

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

void secp256k1_musig_keyaggcoef_sha256(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x6ef02c5a;
  sha->s[1] = 0x6a480de;
  sha->s[2] = 0x1f298665;
  sha->s[3] = 0x1d1134f2;
  sha->s[4] = 0x56a0b063;
  sha->s[5] = 0x52da4147;
  sha->s[6] = 0xf280d9d4;
  sha->s[7] = 0x4484be15;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_musig_keyaggcoef_sha256(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);

    sha->s[0] = 0x6ef02c5aul;
    sha->s[1] = 0x06a480deul;
    sha->s[2] = 0x1f298665ul;
    sha->s[3] = 0x1d1134f2ul;
    sha->s[4] = 0x56a0b063ul;
    sha->s[5] = 0x52da4147ul;
    sha->s[6] = 0xf280d9d4ul;
    sha->s[7] = 0x4484be15ul;
    sha->bytes = 64;
}